

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O2

Error asmjit::v1_14::Formatter::formatFuncValuePack
                (String *sb,FormatFlags formatFlags,BaseCompiler *cc,FuncValuePack *pack,
                RegOnly *vRegs)

{
  uint32_t uVar1;
  Error EVar2;
  FuncValue *pFVar3;
  VirtReg *pVVar4;
  char *pcVar5;
  size_t index;
  uint32_t uVar6;
  
  uVar1 = FuncValuePack::count(pack);
  if (uVar1 == 0) {
    EVar2 = String::_opString(sb,kAppend,"void",0xffffffffffffffff);
    return EVar2;
  }
  if (uVar1 != 1) {
    String::_opChar(sb,kAppend,'[');
  }
  for (index = 0; uVar1 != index; index = index + 1) {
    pFVar3 = FuncValuePack::operator[](pack,index);
    uVar6 = pFVar3->_data;
    if (uVar6 == 0) break;
    if (index != 0) {
      EVar2 = String::_opString(sb,kAppend,", ",0xffffffffffffffff);
      if (EVar2 != 0) {
        return EVar2;
      }
      uVar6 = pFVar3->_data;
    }
    EVar2 = formatTypeId(sb,(TypeId)uVar6);
    if (EVar2 != 0) {
      return EVar2;
    }
    if ((uVar6 & 0x300) != 0) {
      EVar2 = String::_opChar(sb,kAppend,'@');
      if (EVar2 != 0) {
        return EVar2;
      }
      if (((uVar6 >> 10 & 1) != 0) && (EVar2 = String::_opChar(sb,kAppend,'['), EVar2 != 0)) {
        return EVar2;
      }
      if (((uVar6 >> 8 & 1) != 0) &&
         (EVar2 = formatRegister(sb,formatFlags,(BaseEmitter *)cc,
                                 (cc->super_BaseBuilder).super_BaseEmitter._environment._arch,
                                 (RegType)(uVar6 >> 0x18),uVar6 >> 0x10 & 0xff), EVar2 != 0)) {
        return EVar2;
      }
      if (((uVar6 >> 9 & 1) != 0) &&
         (EVar2 = String::_opFormat(sb,kAppend,"[%d]",(ulong)(uint)((int)uVar6 >> 0xc)), EVar2 != 0)
         ) {
        return EVar2;
      }
      if (((uVar6 >> 10 & 1) != 0) && (EVar2 = String::_opChar(sb,kAppend,']'), EVar2 != 0)) {
        return EVar2;
      }
    }
    if (vRegs != (RegOnly *)0x0) {
      pcVar5 = "<none>";
      if (vRegs[index]._signature._bits != 0) {
        pcVar5 = "<none>";
        if (vRegs[index]._id - 0x100 < *(uint *)&cc->field_0x1f0) {
          pVVar4 = BaseCompiler::virtRegById(cc,vRegs[index]._id);
          pcVar5 = "<none>";
          if (pVVar4 != (VirtReg *)0x0) {
            if (*(uint *)(pVVar4 + 0x18) < 0xc) {
              pcVar5 = (char *)(pVVar4 + 0x1c);
            }
            else {
              pcVar5 = *(char **)(pVVar4 + 0x20);
            }
          }
        }
      }
      EVar2 = String::_opFormat(sb,kAppend," %s",pcVar5);
      if (EVar2 != 0) {
        return EVar2;
      }
    }
  }
  if (uVar1 != 1) {
    String::_opChar(sb,kAppend,']');
  }
  return 0;
}

Assistant:

static Error formatFuncValuePack(
  String& sb,
  FormatFlags formatFlags,
  const BaseCompiler* cc,
  const FuncValuePack& pack,
  const RegOnly* vRegs) noexcept {

  size_t count = pack.count();
  if (!count)
    return sb.append("void");

  if (count > 1)
    sb.append('[');

  for (uint32_t valueIndex = 0; valueIndex < count; valueIndex++) {
    const FuncValue& value = pack[valueIndex];
    if (!value)
      break;

    if (valueIndex)
      ASMJIT_PROPAGATE(sb.append(", "));

    ASMJIT_PROPAGATE(formatFuncValue(sb, formatFlags, cc, value));

    if (vRegs) {
      const VirtReg* virtReg = nullptr;
      static const char nullReg[] = "<none>";

      if (vRegs[valueIndex].isReg() && cc->isVirtIdValid(vRegs[valueIndex].id()))
        virtReg = cc->virtRegById(vRegs[valueIndex].id());

      ASMJIT_PROPAGATE(sb.appendFormat(" %s", virtReg ? virtReg->name() : nullReg));
    }
  }

  if (count > 1)
    sb.append(']');

  return kErrorOk;
}